

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

void sptk::world::LinearSmoothing(double *input,double width,int fs,int fft_size,double *output)

{
  double x;
  int iVar1;
  int i_1;
  int x_length;
  uint xi_length;
  double *pdVar2;
  double *y;
  double *xi;
  long lVar3;
  ulong uVar4;
  double *pdVar5;
  double *yi;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  
  dVar13 = (double)fft_size;
  dVar14 = (double)fs;
  iVar12 = (int)((dVar13 * width) / dVar14);
  uVar7 = iVar12 + 1;
  uVar11 = (long)fft_size / 2 & 0xffffffff;
  iVar1 = (int)((long)fft_size / 2);
  uVar8 = iVar1 + iVar12 * 2 + 2;
  x_length = iVar1 + 3 + iVar12 * 2;
  uVar6 = (long)(int)uVar8 * 8 + 8;
  if ((int)uVar8 < -1) {
    uVar6 = 0xffffffffffffffff;
  }
  pdVar2 = (double *)operator_new__(uVar6);
  y = (double *)operator_new__(uVar6);
  xi_length = iVar1 + 1;
  uVar6 = (long)iVar1 * 8 + 8;
  if (fft_size < -3) {
    uVar6 = 0xffffffffffffffff;
  }
  xi = (double *)operator_new__(uVar6);
  lVar3 = (long)(int)uVar7;
  uVar9 = 0;
  uVar4 = 0;
  if (0 < (int)uVar7) {
    uVar4 = (ulong)uVar7;
  }
  pdVar5 = input + (long)iVar12 + 1;
  for (; uVar4 != uVar9; uVar9 = uVar9 + 1) {
    pdVar2[uVar9] = *pdVar5;
    pdVar5 = pdVar5 + -1;
  }
  lVar10 = (long)(int)(uVar7 + iVar1);
  pdVar5 = input;
  for (; lVar3 < lVar10; lVar3 = lVar3 + 1) {
    pdVar2[lVar3] = *pdVar5;
    pdVar5 = pdVar5 + 1;
  }
  for (; lVar10 <= (int)uVar8; lVar10 = lVar10 + 1) {
    pdVar2[lVar10] = input[(int)uVar11];
    uVar11 = (ulong)((int)uVar11 - 1);
  }
  *y = (*pdVar2 * dVar14) / dVar13;
  uVar4 = 0;
  uVar11 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar11 = uVar4;
  }
  for (; uVar11 != uVar4; uVar4 = uVar4 + 1) {
    y[uVar4 + 1] = (pdVar2[uVar4 + 1] * dVar14) / dVar13 + y[uVar4];
  }
  iVar12 = -1;
  if (-1 < iVar1) {
    iVar12 = iVar1;
  }
  for (uVar11 = 0; iVar12 + 1 != uVar11; uVar11 = uVar11 + 1) {
    xi[uVar11] = ((double)(int)uVar11 / dVar13) * dVar14 + width * -0.5;
  }
  pdVar5 = (double *)operator_new__(uVar6);
  yi = (double *)operator_new__(uVar6);
  x = (-((double)(int)uVar7 + -0.5) * dVar14) / dVar13;
  interp1Q(x,dVar14 / dVar13,y,x_length,xi,xi_length,pdVar5);
  uVar6 = 0;
  uVar11 = 0;
  if (0 < (int)xi_length) {
    uVar11 = (ulong)xi_length;
  }
  for (; uVar11 != uVar6; uVar6 = uVar6 + 1) {
    xi[uVar6] = xi[uVar6] + width;
  }
  interp1Q(x,dVar14 / dVar13,y,x_length,xi,xi_length,yi);
  for (uVar6 = 0; uVar11 != uVar6; uVar6 = uVar6 + 1) {
    output[uVar6] = (yi[uVar6] - pdVar5[uVar6]) / width;
  }
  operator_delete__(pdVar2);
  operator_delete__(y);
  operator_delete__(xi);
  operator_delete__(pdVar5);
  operator_delete__(yi);
  return;
}

Assistant:

void LinearSmoothing(const double *input, double width, int fs, int fft_size,
    double *output) {
  int boundary = static_cast<int>(width * fft_size / fs) + 1;

  // These parameters are set by the other function.
  double *mirroring_spectrum = new double[fft_size / 2 + boundary * 2 + 1];
  double *mirroring_segment = new double[fft_size / 2 + boundary * 2 + 1];
  double *frequency_axis = new double[fft_size / 2 + 1];
  SetParametersForLinearSmoothing(boundary, fft_size, fs, width,
      input, mirroring_spectrum, mirroring_segment, frequency_axis);

  double *low_levels = new double[fft_size / 2 + 1];
  double *high_levels = new double[fft_size / 2 + 1];
  double origin_of_mirroring_axis = -(boundary - 0.5) * fs / fft_size;
  double discrete_frequency_interval = static_cast<double>(fs) / fft_size;

  interp1Q(origin_of_mirroring_axis, discrete_frequency_interval,
      mirroring_segment, fft_size / 2 + boundary * 2 + 1, frequency_axis,
      fft_size / 2 + 1, low_levels);

  for (int i = 0; i <= fft_size / 2; ++i) frequency_axis[i] += width;

  interp1Q(origin_of_mirroring_axis, discrete_frequency_interval,
      mirroring_segment, fft_size / 2 + boundary * 2 + 1, frequency_axis,
      fft_size / 2 + 1, high_levels);

  for (int i = 0; i <= fft_size / 2; ++i)
    output[i] = (high_levels[i] - low_levels[i]) / width;

  delete[] mirroring_spectrum;
  delete[] mirroring_segment;
  delete[] frequency_axis;
  delete[] low_levels;
  delete[] high_levels;
}